

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherGeneric.cpp
# Opt level: O3

void __thiscall
efsw::FileWatcherGeneric::FileWatcherGeneric(FileWatcherGeneric *this,FileWatcher *parent)

{
  FileWatcherImpl::FileWatcherImpl(&this->super_FileWatcherImpl,parent);
  (this->super_FileWatcherImpl)._vptr_FileWatcherImpl =
       (_func_int **)&PTR__FileWatcherGeneric_0012fa40;
  this->mThread = (Thread *)0x0;
  this->mLastWatchID = 0;
  (this->mWatches).
  super__Vector_base<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mWatches).
  super__Vector_base<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mWatches).
  super__Vector_base<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Mutex::Mutex(&this->mWatchesLock);
  (this->super_FileWatcherImpl).mInitOK.set_._M_base._M_i = true;
  (this->super_FileWatcherImpl).mIsGeneric = true;
  return;
}

Assistant:

FileWatcherGeneric::FileWatcherGeneric( FileWatcher* parent ) :
	FileWatcherImpl( parent ), mThread( NULL ), mLastWatchID( 0 ) {
	mInitOK = true;
	mIsGeneric = true;
}